

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isDouble(Value *this)

{
  bool bVar1;
  string local_30;
  
  if (this->field_0x8 == '\x04') {
    bVar1 = true;
  }
  else {
    if (this->field_0x8 != '\x05') {
      bVar1 = isIntegral(this);
      return bVar1;
    }
    asString_abi_cxx11_(&local_30,this);
    bVar1 = convertToDouble(local_30._M_dataplus._M_p,(double *)0x0);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool Value::isDouble() const {
  switch (type_) {
  case realValue:
    return true;
  case stringValue:
    return convertToDouble(asString().c_str(), NULL);
  default:
    break;
  }

  return isIntegral();
}